

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>::int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_>::bin_writer<1>_>
          *f)

{
  ulong uVar1;
  vector<wchar_t,std::allocator<wchar_t>> *pvVar2;
  iterator iVar3;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
  *pbVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  wchar_t __tmp;
  wchar_t local_48;
  wchar_t local_44;
  ulong local_40;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
  *local_38;
  
  uVar6 = (ulong)spec->width_;
  uVar1 = f->size_;
  uVar8 = uVar1 - uVar6;
  if (uVar1 < uVar6) {
    local_48 = spec->fill_;
    uVar7 = uVar6 - uVar1;
    if (spec->align_ == ALIGN_CENTER) {
      uVar8 = uVar7 >> 1;
      pvVar2 = *(vector<wchar_t,std::allocator<wchar_t>> **)this;
      local_44 = local_48;
      local_40 = uVar8;
      local_38 = this;
      if (1 < uVar7) {
        do {
          iVar3._M_current = *(wchar_t **)(pvVar2 + 8);
          if (iVar3._M_current == *(wchar_t **)(pvVar2 + 0x10)) {
            std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                      (pvVar2,iVar3,&local_48);
          }
          else {
            *iVar3._M_current = local_48;
            *(wchar_t **)(pvVar2 + 8) = iVar3._M_current + 1;
          }
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      pbVar4 = local_38;
      *(vector<wchar_t,std::allocator<wchar_t>> **)local_38 = pvVar2;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
                    *)f,(back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)
                        local_38);
      pvVar2 = *(vector<wchar_t,std::allocator<wchar_t>> **)pbVar4;
      local_48 = local_44;
      if (uVar7 != local_40) {
        lVar5 = (uVar1 + local_40) - uVar6;
        do {
          iVar3._M_current = *(wchar_t **)(pvVar2 + 8);
          if (iVar3._M_current == *(wchar_t **)(pvVar2 + 0x10)) {
            std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                      (pvVar2,iVar3,&local_48);
          }
          else {
            *iVar3._M_current = local_48;
            *(wchar_t **)(pvVar2 + 8) = iVar3._M_current + 1;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0);
      }
      *(vector<wchar_t,std::allocator<wchar_t>> **)local_38 = pvVar2;
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      pvVar2 = *(vector<wchar_t,std::allocator<wchar_t>> **)this;
      if (uVar7 != 0) {
        lVar5 = uVar1 - uVar6;
        do {
          iVar3._M_current = *(wchar_t **)(pvVar2 + 8);
          if (iVar3._M_current == *(wchar_t **)(pvVar2 + 0x10)) {
            std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                      (pvVar2,iVar3,&local_48);
          }
          else {
            *iVar3._M_current = local_48;
            *(wchar_t **)(pvVar2 + 8) = iVar3._M_current + 1;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0);
      }
      *(vector<wchar_t,std::allocator<wchar_t>> **)this = pvVar2;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
                    *)f,(back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)
                        this);
    }
    else {
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
                    *)f,(back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)
                        this);
      pvVar2 = *(vector<wchar_t,std::allocator<wchar_t>> **)this;
      while (uVar7 != 0) {
        iVar3._M_current = *(wchar_t **)(pvVar2 + 8);
        if (iVar3._M_current == *(wchar_t **)(pvVar2 + 0x10)) {
          std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                    (pvVar2,iVar3,&local_48);
        }
        else {
          *iVar3._M_current = local_48;
          *(wchar_t **)(pvVar2 + 8) = iVar3._M_current + 1;
        }
        uVar8 = uVar8 + 1;
        uVar7 = uVar8;
      }
      *(vector<wchar_t,std::allocator<wchar_t>> **)this = pvVar2;
    }
    return;
  }
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
  ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
                *)f,(back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)this);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }